

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

int Of_CutRef2_rec(Of_Man_t *p,int *pCut)

{
  Of_Obj_t *pOVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int local_34;
  
  local_34 = 1;
  if ((p->Iter & 1) == 0) {
    local_34 = 0;
    if (1 < (*pCut & 0x1fU)) {
      local_34 = (*pCut & 0x1fU) + p->pPars->nAreaTuner;
    }
  }
  if ((*pCut & 0x1f) != 0) {
    uVar5 = 0;
    do {
      uVar4 = pCut[uVar5 + 1];
      if ((int)uVar4 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (uVar4 < 2) {
        return local_34;
      }
      uVar4 = uVar4 >> 1;
      if (p->pObjs[uVar4].iCutH != 0) {
        Vec_IntPush(&p->vCutRefs,uVar4);
        pOVar1 = p->pObjs;
        iVar2 = pOVar1[uVar4].nRefs;
        pOVar1[uVar4].nRefs = iVar2 + 1;
        if (iVar2 == 0) {
          if (p->pGia->nObjs <= (int)uVar4) {
            __assert_fail("iObj>0 && iObj<Gia_ManObjNum(p->pGia)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaOf.c"
                          ,0x90,"int *Of_ObjCutBestP(Of_Man_t *, int)");
          }
          uVar3 = pOVar1[uVar4].iCutH >> 0x10;
          if (((int)uVar3 < 0) || ((p->vPages).nSize <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar2 = Of_CutRef2_rec(p,(int *)((ulong)((pOVar1[uVar4].iCutH & 0xffffU) << 2) +
                                          (long)(p->vPages).pArray[uVar3]));
          local_34 = local_34 + iVar2;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (*pCut & 0x1f));
  }
  return local_34;
}

Assistant:

int Of_CutRef2_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
    {
        if ( !Of_ObjCutBest(p, Var) )
            continue;
        Vec_IntPush( &p->vCutRefs, Var );
        if ( Of_ObjRefInc(p, Var) )
            continue;
        Count += Of_CutRef2_rec( p, Of_ObjCutBestP(p, Var) );
    }
    return Count;
}